

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapPerm.c
# Opt level: O0

void Amap_LibCollectFanins_rec(Amap_Lib_t *pLib,Amap_Nod_t *pNod,Vec_Int_t *vFanins)

{
  int iVar1;
  Amap_Nod_t *pAVar2;
  Amap_Nod_t *pFan1;
  Amap_Nod_t *pFan0;
  Vec_Int_t *vFanins_local;
  Amap_Nod_t *pNod_local;
  Amap_Lib_t *pLib_local;
  
  if (((undefined1  [24])*pNod & (undefined1  [24])0xffff) == (undefined1  [24])0x0) {
    Vec_IntPush(vFanins,0);
  }
  else {
    iVar1 = Abc_Lit2Var((int)pNod->iFan0);
    pAVar2 = Amap_LibNod(pLib,iVar1);
    iVar1 = Abc_LitIsCompl((int)pNod->iFan0);
    if ((iVar1 == 0) && (*(uint *)pAVar2 >> 0x18 == *(uint *)pNod >> 0x18)) {
      Amap_LibCollectFanins_rec(pLib,pAVar2,vFanins);
    }
    else {
      Vec_IntPush(vFanins,(int)pNod->iFan0);
    }
    iVar1 = Abc_Lit2Var((int)pNod->iFan1);
    pAVar2 = Amap_LibNod(pLib,iVar1);
    iVar1 = Abc_LitIsCompl((int)pNod->iFan1);
    if ((iVar1 == 0) && (*(uint *)pAVar2 >> 0x18 == *(uint *)pNod >> 0x18)) {
      Amap_LibCollectFanins_rec(pLib,pAVar2,vFanins);
    }
    else {
      Vec_IntPush(vFanins,(int)pNod->iFan1);
    }
  }
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Collects fanins of the node.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Amap_LibCollectFanins_rec( Amap_Lib_t * pLib, Amap_Nod_t * pNod, Vec_Int_t * vFanins )
{
    Amap_Nod_t * pFan0, * pFan1;
    if ( pNod->Id == 0 )
    {
        Vec_IntPush( vFanins, 0 );
        return;
    }
    pFan0 = Amap_LibNod( pLib, Abc_Lit2Var(pNod->iFan0) );
    if ( Abc_LitIsCompl(pNod->iFan0) || pFan0->Type != pNod->Type )
        Vec_IntPush( vFanins, pNod->iFan0 );
    else
        Amap_LibCollectFanins_rec( pLib, pFan0, vFanins );
    pFan1 = Amap_LibNod( pLib, Abc_Lit2Var(pNod->iFan1) );
    if ( Abc_LitIsCompl(pNod->iFan1) || pFan1->Type != pNod->Type )
        Vec_IntPush( vFanins, pNod->iFan1 );
    else
        Amap_LibCollectFanins_rec( pLib, pFan1, vFanins );
}